

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::SetFocusID(ImGuiID id,ImGuiWindow *window)

{
  ImRect *pIVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  ImGuiNavLayer IVar7;
  ImGuiContext *pIVar8;
  
  pIVar8 = GImGui;
  if (id == 0) {
    __assert_fail("id != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/imgui-1.70/imgui.cpp"
                  ,0xa8d,"void ImGui::SetFocusID(ImGuiID, ImGuiWindow *)");
  }
  IVar7 = (window->DC).NavLayerCurrent;
  if (GImGui->NavWindow != window) {
    GImGui->NavInitRequest = false;
  }
  pIVar8->NavId = id;
  pIVar8->NavWindow = window;
  pIVar8->NavLayer = IVar7;
  window->NavLastIds[IVar7] = id;
  if ((window->DC).LastItemId == id) {
    fVar2 = (window->Pos).x;
    fVar3 = (window->Pos).y;
    fVar4 = (window->DC).LastItemRect.Min.y;
    fVar5 = (window->DC).LastItemRect.Max.x;
    fVar6 = (window->DC).LastItemRect.Max.y;
    pIVar1 = window->NavRectRel + IVar7;
    (pIVar1->Min).x = (window->DC).LastItemRect.Min.x - fVar2;
    (pIVar1->Min).y = fVar4 - fVar3;
    (pIVar1->Max).x = fVar5 - fVar2;
    (pIVar1->Max).y = fVar6 - fVar3;
  }
  if (pIVar8->ActiveIdSource == ImGuiInputSource_Nav) {
    pIVar8->NavDisableMouseHover = true;
    return;
  }
  pIVar8->NavDisableHighlight = true;
  return;
}

Assistant:

void ImGui::SetFocusID(ImGuiID id, ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(id != 0);

    // Assume that SetFocusID() is called in the context where its NavLayer is the current layer, which is the case everywhere we call it.
    const ImGuiNavLayer nav_layer = window->DC.NavLayerCurrent;
    if (g.NavWindow != window)
        g.NavInitRequest = false;
    g.NavId = id;
    g.NavWindow = window;
    g.NavLayer = nav_layer;
    window->NavLastIds[nav_layer] = id;
    if (window->DC.LastItemId == id)
        window->NavRectRel[nav_layer] = ImRect(window->DC.LastItemRect.Min - window->Pos, window->DC.LastItemRect.Max - window->Pos);

    if (g.ActiveIdSource == ImGuiInputSource_Nav)
        g.NavDisableMouseHover = true;
    else
        g.NavDisableHighlight = true;
}